

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutApi.c
# Opt level: O2

void Cut_NodeTryDroppingCuts(Cut_Man_t *p,int Node)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  
  pVVar1 = p->vFanCounts;
  if (pVVar1 == (Vec_Int_t *)0x0) {
    __assert_fail("p->vFanCounts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutApi.c"
                  ,0xa5,"void Cut_NodeTryDroppingCuts(Cut_Man_t *, int)");
  }
  if ((Node < 0) || (iVar2 = pVVar1->nSize, iVar2 <= Node)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if (pVVar1->pArray[(uint)Node] < 1) {
    __assert_fail("nFanouts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutApi.c"
                  ,0xa7,"void Cut_NodeTryDroppingCuts(Cut_Man_t *, int)");
  }
  iVar3 = pVVar1->pArray[(uint)Node] + -1;
  if (iVar3 == 0) {
    Cut_NodeFreeCuts(p,Node);
    pVVar1 = p->vFanCounts;
    iVar2 = pVVar1->nSize;
  }
  if (Node < iVar2) {
    pVVar1->pArray[(uint)Node] = iVar3;
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Cut_NodeTryDroppingCuts( Cut_Man_t * p, int Node )
{
    int nFanouts;
    assert( p->vFanCounts );
    nFanouts = Vec_IntEntry( p->vFanCounts, Node );
    assert( nFanouts > 0 );
    if ( --nFanouts == 0 )
        Cut_NodeFreeCuts( p, Node );
    Vec_IntWriteEntry( p->vFanCounts, Node, nFanouts );
}